

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O2

int __thiscall
zmq::tcp_connecter_t::connect(tcp_connecter_t *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int *piVar2;
  char *errmsg_;
  int iVar3;
  int err;
  socklen_t len;
  
  err = 0;
  len = 4;
  iVar1 = getsockopt((this->super_stream_connecter_base_t)._s,1,4,&err,&len);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    err = *piVar2;
  }
  iVar1 = err;
  if (err == 0) {
    iVar3 = (this->super_stream_connecter_base_t)._s;
    (this->super_stream_connecter_base_t)._s = -1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    iVar3 = -1;
    if (((iVar1 - 0x58U < 0x12) && ((0x20011U >> (iVar1 - 0x58U & 0x1f) & 1) != 0)) || (iVar1 == 9))
    {
      errmsg_ = strerror(iVar1);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
              ,0x122);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
  }
  return iVar3;
}

Assistant:

zmq::fd_t zmq::tcp_connecter_t::connect ()
{
    //  Async connect has finished. Check whether an error occurred
    int err = 0;
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int len = sizeof err;
#else
    socklen_t len = sizeof err;
#endif

    const int rc = getsockopt (_s, SOL_SOCKET, SO_ERROR,
                               reinterpret_cast<char *> (&err), &len);

    //  Assert if the error was caused by 0MQ bug.
    //  Networking problems are OK. No need to assert.
#ifdef ZMQ_HAVE_WINDOWS
    zmq_assert (rc == 0);
    if (err != 0) {
        if (err == WSAEBADF || err == WSAENOPROTOOPT || err == WSAENOTSOCK
            || err == WSAENOBUFS) {
            wsa_assert_no (err);
        }
        errno = wsa_error_to_errno (err);
        return retired_fd;
    }
#else
    //  Following code should handle both Berkeley-derived socket
    //  implementations and Solaris.
    if (rc == -1)
        err = errno;
    if (err != 0) {
        errno = err;
#if !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EBADF && errno != ENOPROTOOPT
                      && errno != ENOTSOCK && errno != ENOBUFS);
#else
        errno_assert (errno != ENOPROTOOPT && errno != ENOTSOCK
                      && errno != ENOBUFS);
#endif
        return retired_fd;
    }
#endif

    //  Return the newly connected socket.
    const fd_t result = _s;
    _s = retired_fd;
    return result;
}